

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

item_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::operator[]
          (item_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,char *key)

{
  PyObject *pPVar1;
  handle hVar2;
  handle local_28;
  object local_20;
  
  pPVar1 = *(PyObject **)this;
  pybind11::str::str((str *)&local_28,key);
  hVar2.m_ptr = local_28.m_ptr;
  local_28.m_ptr = (PyObject *)0x0;
  (__return_storage_ptr__->obj).m_ptr = pPVar1;
  local_20.super_handle.m_ptr = (handle)(PyObject *)0x0;
  (__return_storage_ptr__->key).super_handle.m_ptr = hVar2.m_ptr;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object(&local_20);
  object::~object((object *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

item_accessor object_api<D>::operator[](const char *key) const {
    return {derived(), pybind11::str(key)};
}